

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

int addPropertiesToAMQPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,MESSAGE_HANDLE uamqp_message,
              AMQP_VALUE to_amqp_value)

{
  PROPERTIES_HANDLE pPVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE pAVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  PROPERTIES_HANDLE uamqp_message_properties;
  PROPERTIES_HANDLE local_38;
  
  local_38 = (PROPERTIES_HANDLE)0x0;
  iVar2 = message_get_properties(uamqp_message,&local_38);
  if (iVar2 != 0) {
    p_Var3 = xlogging_get_log_function();
    iVar6 = 0x11b;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x11b;
    }
    pcVar7 = "Failed to get properties map from uAMQP message (error code %d).";
    iVar5 = 0x11a;
LAB_00130f4d:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
              ,"addPropertiesToAMQPMessage",iVar5,1,pcVar7,iVar2);
    return iVar6;
  }
  if ((local_38 == (PROPERTIES_HANDLE)0x0) &&
     (local_38 = properties_create(), local_38 == (PROPERTIES_HANDLE)0x0)) {
    p_Var3 = xlogging_get_log_function();
    iVar6 = 0x121;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x121;
    }
    iVar2 = 0;
    pcVar7 = "Failed to create properties map for uAMQP message (error code %d).";
    iVar5 = 0x120;
    goto LAB_00130f4d;
  }
  pPVar1 = local_38;
  pcVar7 = IoTHubMessage_GetMessageId(iothub_message_handle);
  if (pcVar7 == (char *)0x0) {
LAB_001310a8:
    pPVar1 = local_38;
    pcVar7 = IoTHubMessage_GetCorrelationId(iothub_message_handle);
    if (pcVar7 == (char *)0x0) {
LAB_0013119a:
      iVar2 = properties_set_to(local_38,to_amqp_value);
      if (iVar2 == 0) {
        iVar2 = message_set_properties(uamqp_message,local_38);
        if (iVar2 == 0) {
          iVar2 = 0;
          goto LAB_0013122a;
        }
        p_Var3 = xlogging_get_log_function();
        iVar2 = 0x139;
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013122a;
        pcVar7 = "Failed to set properties map on uAMQP message (error code %d).";
        iVar6 = 0x138;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        iVar2 = 0x134;
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013122a;
        pcVar7 = "Could not create properties for message - properties_set_to failed";
        iVar6 = 0x133;
      }
    }
    else {
      pAVar4 = amqpvalue_create_string(pcVar7);
      if (pAVar4 == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"setCorrelationId",0xf7,1,
                    "Failed to create an AMQP_VALUE for the messageId property value.");
        }
      }
      else {
        iVar2 = properties_set_correlation_id(pPVar1,pAVar4);
        if (iVar2 == 0) {
          amqpvalue_destroy(pAVar4);
          goto LAB_0013119a;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"setCorrelationId",0x100,1,
                    "Failed to set value of uAMQP message \'message-id\' property (%d).",iVar2);
        }
        amqpvalue_destroy(pAVar4);
      }
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x12d;
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013122a;
      pcVar7 = "Failed to set uampq correlationId.";
      iVar6 = 300;
    }
  }
  else {
    pAVar4 = amqpvalue_create_string(pcVar7);
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"setMessageId",0xd2,1,
                  "Failed to create an AMQP_VALUE for the messageId property value.");
      }
    }
    else {
      iVar2 = properties_set_message_id(pPVar1,pAVar4);
      if (iVar2 == 0) {
        amqpvalue_destroy(pAVar4);
        goto LAB_001310a8;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"setMessageId",0xdb,1,
                  "Failed to set value of uAMQP message \'message-id\' property (%d).",iVar2);
      }
      amqpvalue_destroy(pAVar4);
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x128;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013122a;
    pcVar7 = "Failed to set uampq messageId.";
    iVar6 = 0x127;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
            ,"addPropertiesToAMQPMessage",iVar6,1,pcVar7);
LAB_0013122a:
  properties_destroy(local_38);
  return iVar2;
}

Assistant:

static int addPropertiesToAMQPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, MESSAGE_HANDLE uamqp_message, AMQP_VALUE to_amqp_value)
{
    int result;
    PROPERTIES_HANDLE uamqp_message_properties = NULL; /* This initialization is forced by Valgrind */
    int api_call_result;

    if ((api_call_result = message_get_properties(uamqp_message, &uamqp_message_properties)) != 0)
    {
        LogError("Failed to get properties map from uAMQP message (error code %d).", api_call_result);
        result = MU_FAILURE;
    }
    else if (uamqp_message_properties == NULL &&
        (uamqp_message_properties = properties_create()) == NULL)
    {
        LogError("Failed to create properties map for uAMQP message (error code %d).", api_call_result);
        result = MU_FAILURE;
    }
    else
    {
        if (setMessageId(iothub_message_handle, uamqp_message_properties) != 0)
        {
            LogError("Failed to set uampq messageId.");
            result = MU_FAILURE;
        }
        else if (setCorrelationId(iothub_message_handle, uamqp_message_properties) != 0)
        {
            LogError("Failed to set uampq correlationId.");
            result = MU_FAILURE;
        }
        else
        {
            if ((properties_set_to(uamqp_message_properties, to_amqp_value)) != 0)
            {
                LogError("Could not create properties for message - properties_set_to failed");
                result = MU_FAILURE;
            }
            else if ((api_call_result = message_set_properties(uamqp_message, uamqp_message_properties)) != 0)
            {
                LogError("Failed to set properties map on uAMQP message (error code %d).", api_call_result);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        properties_destroy(uamqp_message_properties);
    }
    return result;
}